

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IterSetOutputCb(int *pRc,Fts5Iter *pIter)

{
  int iVar1;
  u32 nByte;
  Fts5Config *pFVar2;
  code *pcVar3;
  
  if (*pRc != 0) {
    return;
  }
  pFVar2 = pIter->pIndex->pConfig;
  iVar1 = pFVar2->eDetail;
  if (iVar1 == 1) {
    pcVar3 = fts5IterSetOutputs_None;
  }
  else if (pIter->pColset == (Fts5Colset *)0x0) {
    pcVar3 = fts5IterSetOutputs_Nocolset;
  }
  else if (pIter->pColset->nCol == 0) {
    pcVar3 = fts5IterSetOutputs_ZeroColset;
  }
  else if (iVar1 == 0) {
    pcVar3 = fts5IterSetOutputs_Full;
  }
  else {
    nByte = pFVar2->nCol;
    if ((int)nByte < 0x65) {
      pIter->xSetOutputs = fts5IterSetOutputs_Col100;
      sqlite3Fts5BufferSize(pRc,&pIter->poslist,nByte);
      return;
    }
    pcVar3 = fts5IterSetOutputs_Col;
  }
  pIter->xSetOutputs = pcVar3;
  return;
}

Assistant:

static void fts5IterSetOutputCb(int *pRc, Fts5Iter *pIter){
  if( *pRc==SQLITE_OK ){
    Fts5Config *pConfig = pIter->pIndex->pConfig;
    if( pConfig->eDetail==FTS5_DETAIL_NONE ){
      pIter->xSetOutputs = fts5IterSetOutputs_None;
    }

    else if( pIter->pColset==0 ){
      pIter->xSetOutputs = fts5IterSetOutputs_Nocolset;
    }

    else if( pIter->pColset->nCol==0 ){
      pIter->xSetOutputs = fts5IterSetOutputs_ZeroColset;
    }

    else if( pConfig->eDetail==FTS5_DETAIL_FULL ){
      pIter->xSetOutputs = fts5IterSetOutputs_Full;
    }

    else{
      assert( pConfig->eDetail==FTS5_DETAIL_COLUMNS );
      if( pConfig->nCol<=100 ){
        pIter->xSetOutputs = fts5IterSetOutputs_Col100;
        sqlite3Fts5BufferSize(pRc, &pIter->poslist, pConfig->nCol);
      }else{
        pIter->xSetOutputs = fts5IterSetOutputs_Col;
      }
    }
  }
}